

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25095d::ArraySubscriptExpr::printLeft(ArraySubscriptExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  Node::print(this->Op1,S);
  R_00.Last = "";
  R_00.First = ")[";
  OutputStream::operator+=(S,R_00);
  Node::print(this->Op2,S);
  R_01.Last = "";
  R_01.First = "]";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Op1->print(S);
    S += ")[";
    Op2->print(S);
    S += "]";
  }